

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O0

bool __thiscall
deqp::gls::MultiVertexArrayTest::isUnalignedBufferOffsetTest(MultiVertexArrayTest *this)

{
  size_type sVar1;
  const_reference pvVar2;
  bool bVar3;
  int local_28;
  int dataTypeSize;
  bool inputTypePacked;
  size_t i;
  MultiVertexArrayTest *this_local;
  
  _dataTypeSize = 0;
  do {
    sVar1 = std::
            vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
            ::size(&(this->m_spec).arrays);
    if (sVar1 <= _dataTypeSize) {
      return false;
    }
    pvVar2 = std::
             vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
             ::operator[](&(this->m_spec).arrays,_dataTypeSize);
    if (pvVar2->storage == STORAGE_BUFFER) {
      pvVar2 = std::
               vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
               ::operator[](&(this->m_spec).arrays,_dataTypeSize);
      bVar3 = true;
      if (pvVar2->inputType != INPUTTYPE_UNSIGNED_INT_2_10_10_10) {
        pvVar2 = std::
                 vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                 ::operator[](&(this->m_spec).arrays,_dataTypeSize);
        bVar3 = pvVar2->inputType == INPUTTYPE_INT_2_10_10_10;
      }
      pvVar2 = std::
               vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
               ::operator[](&(this->m_spec).arrays,_dataTypeSize);
      local_28 = gls::Array::inputTypeSize(pvVar2->inputType);
      if (bVar3) {
        local_28 = 4;
      }
      pvVar2 = std::
               vector<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
               ::operator[](&(this->m_spec).arrays,_dataTypeSize);
      if (pvVar2->offset % local_28 != 0) {
        return true;
      }
    }
    _dataTypeSize = _dataTypeSize + 1;
  } while( true );
}

Assistant:

bool MultiVertexArrayTest::isUnalignedBufferOffsetTest (void) const
{
	// Buffer offsets should be data type size aligned
	for (size_t i = 0; i < m_spec.arrays.size(); ++i)
	{
		if (m_spec.arrays[i].storage == Array::STORAGE_BUFFER)
		{
			const bool inputTypePacked = m_spec.arrays[i].inputType == Array::INPUTTYPE_UNSIGNED_INT_2_10_10_10 || m_spec.arrays[i].inputType == Array::INPUTTYPE_INT_2_10_10_10;

			int dataTypeSize = Array::inputTypeSize(m_spec.arrays[i].inputType);
			if (inputTypePacked)
				dataTypeSize = 4;

			if (m_spec.arrays[i].offset % dataTypeSize != 0)
				return true;
		}
	}

	return false;
}